

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Delaunay_psm.cpp
# Opt level: O0

Sign anon_unknown.dwarf_5292d::side3_exact_SOS
               (double *p0,double *p1,double *p2,double *p3,double *q0,double *q1,double *q2,
               coord_index_t dim)

{
  long lVar1;
  double dVar2;
  allocator *paVar3;
  double *pdVar4;
  double *pdVar5;
  double *pdVar6;
  index_t iVar7;
  int iVar8;
  size_t sVar9;
  expansion *peVar10;
  expansion *peVar11;
  expansion *peVar12;
  expansion *peVar13;
  expansion *peVar14;
  expansion *peVar15;
  expansion *peVar16;
  uchar *sig;
  uchar *sig_00;
  uchar *sig_01;
  uchar *sig_02;
  uchar *sig_03;
  double dStack_480;
  expansion eStack_478;
  expansion *local_460;
  expansion *local_458;
  expansion *local_450;
  expansion *local_448;
  expansion *local_440;
  expansion *local_438;
  expansion *local_430;
  expansion *local_428;
  expansion *local_420;
  expansion *local_418;
  expansion *local_410;
  expansion *local_408;
  expansion *local_400;
  expansion *local_3f8;
  expansion *local_3f0;
  expansion *local_3e8;
  expansion *local_3e0;
  expansion *local_3d8;
  expansion *local_3d0;
  expansion *local_3c8;
  expansion *local_3c0;
  expansion *local_3b8;
  expansion *local_3b0;
  expansion *local_3a8;
  expansion *local_3a0;
  expansion *local_398;
  expansion *local_390;
  expansion *local_388;
  allocator *local_380;
  allocator *local_378;
  expansion *local_370;
  expansion *local_368;
  expansion *local_360;
  expansion *local_358;
  expansion *local_350;
  expansion *local_348;
  expansion *local_340;
  expansion *local_338;
  expansion *local_330;
  expansion *local_328;
  expansion *local_320;
  expansion *local_318;
  double local_310;
  expansion *local_308;
  expansion *local_300;
  expansion *local_2f8;
  expansion *local_2f0;
  expansion *local_2e8;
  expansion *local_2e0;
  expansion *local_2d8;
  expansion *local_2d0;
  expansion *local_2c8;
  expansion *local_2c0;
  allocator local_2b1;
  string local_2b0 [36];
  undefined4 local_28c;
  expansion *peStack_288;
  Sign z_sign_2;
  expansion *z_2;
  expansion *z3_2;
  expansion *z2_2;
  expansion *z1_2;
  expansion *peStack_260;
  Sign z_sign_1;
  expansion *z_1;
  expansion *z3_1;
  expansion *z2_1;
  expansion *z1_1;
  expansion *peStack_238;
  Sign z_sign;
  expansion *z;
  expansion *z3;
  expansion *z3_0;
  expansion *z2;
  expansion *z2_0;
  expansion *z1;
  expansion *z1_0;
  double *pdStack_1f8;
  index_t i;
  double *p_sort [4];
  Sign r_sign;
  expansion *r;
  expansion *r3;
  expansion *r2;
  expansion *r1;
  expansion *r0;
  expansion *DeltaLambda2;
  expansion *b22_l2;
  expansion *b21_l1;
  expansion *DeltaLambda1;
  expansion *b12_l2;
  expansion *b11_l1;
  expansion *DeltaLambda0;
  expansion *b02_l2;
  expansion *b01_l1;
  string local_150 [55];
  allocator local_119;
  string local_118 [36];
  int local_f4;
  expansion *peStack_f0;
  Sign Delta_sign;
  expansion *Delta;
  expansion *b22;
  expansion *b21;
  expansion *b20;
  expansion *b12;
  expansion *b11;
  expansion *b10;
  expansion *b02;
  expansion *b01;
  expansion *b00;
  expansion *a32;
  expansion *a31;
  expansion *a30;
  expansion *a22;
  expansion *a21;
  expansion *a20;
  expansion *a12;
  expansion *a11;
  expansion *a10;
  expansion *l3;
  expansion *l2;
  expansion *l1;
  double *q1_local;
  double *q0_local;
  double *p3_local;
  double *p2_local;
  double *p1_local;
  double *p0_local;
  
  dStack_480 = 9.23848904567734e-318;
  l1 = (expansion *)q1;
  q1_local = q0;
  q0_local = p3;
  p3_local = p2;
  p2_local = p1;
  p1_local = p0;
  iVar7 = GEO::expansion::sq_dist_capacity(dim);
  dStack_480 = 9.23852363027255e-318;
  sVar9 = GEO::expansion::bytes(iVar7);
  lVar1 = -(sVar9 + 0xf & 0xfffffffffffffff0);
  local_370 = (expansion *)((long)&eStack_478 + lVar1);
  *(undefined8 *)((long)&eStack_478 + lVar1 + -8) = 0x1c886e;
  iVar7 = GEO::expansion::sq_dist_capacity(dim);
  peVar11 = local_370;
  *(undefined8 *)((long)&eStack_478 + lVar1 + -8) = 0x1c887c;
  GEO::expansion::expansion(peVar11,iVar7);
  pdVar5 = p1_local;
  pdVar4 = p2_local;
  peVar11 = local_370;
  *(undefined8 *)((long)&eStack_478 + lVar1 + -8) = 0x1c8894;
  l2 = GEO::expansion::assign_sq_dist(peVar11,pdVar4,pdVar5,dim);
  *(undefined8 *)((long)&eStack_478 + lVar1 + -8) = 0x1c88a1;
  iVar7 = GEO::expansion::sq_dist_capacity(dim);
  *(undefined8 *)((long)&eStack_478 + lVar1 + -8) = 0x1c88a8;
  sVar9 = GEO::expansion::bytes(iVar7);
  peVar10 = (expansion *)(((long)&eStack_478 + lVar1) - (sVar9 + 0xf & 0xfffffffffffffff0));
  local_368 = peVar10;
  peVar10[-1].x_[1] = 9.23916591561215e-318;
  iVar7 = GEO::expansion::sq_dist_capacity(dim);
  peVar11 = local_368;
  peVar10[-1].x_[1] = 9.23923508480256e-318;
  GEO::expansion::expansion(peVar11,iVar7);
  pdVar5 = p1_local;
  pdVar4 = p3_local;
  peVar11 = local_368;
  peVar10[-1].x_[1] = 9.23935366055757e-318;
  l3 = GEO::expansion::assign_sq_dist(peVar11,pdVar4,pdVar5,dim);
  peVar10[-1].x_[1] = 9.23941788909152e-318;
  iVar7 = GEO::expansion::sq_dist_capacity(dim);
  peVar10[-1].x_[1] = 9.23945247368673e-318;
  sVar9 = GEO::expansion::bytes(iVar7);
  peVar10 = (expansion *)((long)peVar10 - (sVar9 + 0xf & 0xfffffffffffffff0));
  local_360 = peVar10;
  peVar10[-1].x_[1] = 9.23963033731924e-318;
  iVar7 = GEO::expansion::sq_dist_capacity(dim);
  peVar11 = local_360;
  peVar10[-1].x_[1] = 9.23969950650965e-318;
  GEO::expansion::expansion(peVar11,iVar7);
  pdVar5 = p1_local;
  pdVar4 = q0_local;
  peVar11 = local_360;
  peVar10[-1].x_[1] = 9.23981808226466e-318;
  a10 = GEO::expansion::assign_sq_dist(peVar11,pdVar4,pdVar5,dim);
  peVar10[-1].x_[1] = 9.23988231079862e-318;
  iVar7 = GEO::expansion::dot_at_capacity(dim);
  peVar10[-1].x_[1] = 9.23991689539382e-318;
  sVar9 = GEO::expansion::bytes(iVar7);
  peVar10 = (expansion *)((long)peVar10 - (sVar9 + 0xf & 0xfffffffffffffff0));
  local_358 = peVar10;
  peVar10[-1].x_[1] = 9.24009475902633e-318;
  iVar7 = GEO::expansion::dot_at_capacity(dim);
  peVar11 = local_358;
  peVar10[-1].x_[1] = 9.24016392821675e-318;
  GEO::expansion::expansion(peVar11,iVar7);
  pdVar6 = p1_local;
  pdVar5 = p2_local;
  pdVar4 = q1_local;
  peVar11 = local_358;
  peVar10[-1].x_[1] = 9.24030720725404e-318;
  peVar11 = GEO::expansion::assign_dot_at(peVar11,pdVar5,pdVar4,pdVar6,dim);
  local_310 = 2.0;
  peVar10[-1].x_[1] = 9.24042578300904e-318;
  a11 = GEO::expansion::scale_fast(peVar11,2.0);
  peVar10[-1].x_[1] = 9.240490011543e-318;
  iVar7 = GEO::expansion::dot_at_capacity(dim);
  peVar10[-1].x_[1] = 9.24052459613821e-318;
  sVar9 = GEO::expansion::bytes(iVar7);
  peVar10 = (expansion *)((long)peVar10 - (sVar9 + 0xf & 0xfffffffffffffff0));
  local_350 = peVar10;
  peVar10[-1].x_[1] = 9.24070245977071e-318;
  iVar7 = GEO::expansion::dot_at_capacity(dim);
  peVar11 = local_350;
  peVar10[-1].x_[1] = 9.24077162896113e-318;
  GEO::expansion::expansion(peVar11,iVar7);
  pdVar5 = p1_local;
  pdVar4 = p2_local;
  peVar16 = l1;
  peVar11 = local_350;
  peVar10[-1].x_[1] = 9.24091490799842e-318;
  peVar11 = GEO::expansion::assign_dot_at(peVar11,pdVar4,(double *)peVar16,pdVar5,dim);
  dVar2 = local_310;
  peVar10[-1].x_[1] = 9.24099395850176e-318;
  a12 = GEO::expansion::scale_fast(peVar11,dVar2);
  peVar10[-1].x_[1] = 9.24105818703572e-318;
  iVar7 = GEO::expansion::dot_at_capacity(dim);
  peVar10[-1].x_[1] = 9.24109277163093e-318;
  sVar9 = GEO::expansion::bytes(iVar7);
  peVar10 = (expansion *)((long)peVar10 - (sVar9 + 0xf & 0xfffffffffffffff0));
  local_348 = peVar10;
  peVar10[-1].x_[1] = 9.24127063526343e-318;
  iVar7 = GEO::expansion::dot_at_capacity(dim);
  peVar11 = local_348;
  peVar10[-1].x_[1] = 9.24133980445385e-318;
  GEO::expansion::expansion(peVar11,iVar7);
  pdVar5 = p1_local;
  pdVar4 = p2_local;
  peVar11 = local_348;
  peVar10[-1].x_[1] = 9.24148308349114e-318;
  peVar11 = GEO::expansion::assign_dot_at(peVar11,pdVar4,q2,pdVar5,dim);
  dVar2 = local_310;
  peVar10[-1].x_[1] = 9.24156213399448e-318;
  a20 = GEO::expansion::scale_fast(peVar11,dVar2);
  peVar10[-1].x_[1] = 9.24162636252844e-318;
  iVar7 = GEO::expansion::dot_at_capacity(dim);
  peVar10[-1].x_[1] = 9.24166094712364e-318;
  sVar9 = GEO::expansion::bytes(iVar7);
  peVar10 = (expansion *)((long)peVar10 - (sVar9 + 0xf & 0xfffffffffffffff0));
  local_340 = peVar10;
  peVar10[-1].x_[1] = 9.24183881075615e-318;
  iVar7 = GEO::expansion::dot_at_capacity(dim);
  peVar11 = local_340;
  peVar10[-1].x_[1] = 9.24190797994656e-318;
  GEO::expansion::expansion(peVar11,iVar7);
  pdVar6 = p1_local;
  pdVar5 = p3_local;
  pdVar4 = q1_local;
  peVar11 = local_340;
  peVar10[-1].x_[1] = 9.24205125898386e-318;
  peVar11 = GEO::expansion::assign_dot_at(peVar11,pdVar5,pdVar4,pdVar6,dim);
  dVar2 = local_310;
  peVar10[-1].x_[1] = 9.24213030948719e-318;
  a21 = GEO::expansion::scale_fast(peVar11,dVar2);
  peVar10[-1].x_[1] = 9.24219453802115e-318;
  iVar7 = GEO::expansion::dot_at_capacity(dim);
  peVar10[-1].x_[1] = 9.24222912261636e-318;
  sVar9 = GEO::expansion::bytes(iVar7);
  peVar10 = (expansion *)((long)peVar10 - (sVar9 + 0xf & 0xfffffffffffffff0));
  local_338 = peVar10;
  peVar10[-1].x_[1] = 9.24240698624886e-318;
  iVar7 = GEO::expansion::dot_at_capacity(dim);
  peVar11 = local_338;
  peVar10[-1].x_[1] = 9.24247615543928e-318;
  GEO::expansion::expansion(peVar11,iVar7);
  pdVar5 = p1_local;
  pdVar4 = p3_local;
  peVar16 = l1;
  peVar11 = local_338;
  peVar10[-1].x_[1] = 9.24261943447658e-318;
  peVar11 = GEO::expansion::assign_dot_at(peVar11,pdVar4,(double *)peVar16,pdVar5,dim);
  dVar2 = local_310;
  peVar10[-1].x_[1] = 9.24269848497991e-318;
  a22 = GEO::expansion::scale_fast(peVar11,dVar2);
  peVar10[-1].x_[1] = 9.24276271351387e-318;
  iVar7 = GEO::expansion::dot_at_capacity(dim);
  peVar10[-1].x_[1] = 9.24279729810908e-318;
  sVar9 = GEO::expansion::bytes(iVar7);
  peVar10 = (expansion *)((long)peVar10 - (sVar9 + 0xf & 0xfffffffffffffff0));
  local_330 = peVar10;
  peVar10[-1].x_[1] = 9.24297516174158e-318;
  iVar7 = GEO::expansion::dot_at_capacity(dim);
  peVar11 = local_330;
  peVar10[-1].x_[1] = 9.243044330932e-318;
  GEO::expansion::expansion(peVar11,iVar7);
  pdVar5 = p1_local;
  pdVar4 = p3_local;
  peVar11 = local_330;
  peVar10[-1].x_[1] = 9.24318760996929e-318;
  peVar11 = GEO::expansion::assign_dot_at(peVar11,pdVar4,q2,pdVar5,dim);
  dVar2 = local_310;
  peVar10[-1].x_[1] = 9.24326666047263e-318;
  a30 = GEO::expansion::scale_fast(peVar11,dVar2);
  peVar10[-1].x_[1] = 9.24333088900659e-318;
  iVar7 = GEO::expansion::dot_at_capacity(dim);
  peVar10[-1].x_[1] = 9.2433654736018e-318;
  sVar9 = GEO::expansion::bytes(iVar7);
  peVar10 = (expansion *)((long)peVar10 - (sVar9 + 0xf & 0xfffffffffffffff0));
  local_328 = peVar10;
  peVar10[-1].x_[1] = 9.2435433372343e-318;
  iVar7 = GEO::expansion::dot_at_capacity(dim);
  peVar11 = local_328;
  peVar10[-1].x_[1] = 9.24361250642472e-318;
  GEO::expansion::expansion(peVar11,iVar7);
  pdVar6 = p1_local;
  pdVar5 = q0_local;
  pdVar4 = q1_local;
  peVar11 = local_328;
  peVar10[-1].x_[1] = 9.24375578546201e-318;
  peVar11 = GEO::expansion::assign_dot_at(peVar11,pdVar5,pdVar4,pdVar6,dim);
  dVar2 = local_310;
  peVar10[-1].x_[1] = 9.24383483596535e-318;
  a31 = GEO::expansion::scale_fast(peVar11,dVar2);
  peVar10[-1].x_[1] = 9.24391388646868e-318;
  iVar7 = GEO::expansion::dot_at_capacity(dim);
  peVar10[-1].x_[1] = 9.24394847106389e-318;
  sVar9 = GEO::expansion::bytes(iVar7);
  peVar10 = (expansion *)((long)peVar10 - (sVar9 + 0xf & 0xfffffffffffffff0));
  local_320 = peVar10;
  peVar10[-1].x_[1] = 9.24412633469639e-318;
  iVar7 = GEO::expansion::dot_at_capacity(dim);
  peVar11 = local_320;
  peVar10[-1].x_[1] = 9.24419550388681e-318;
  GEO::expansion::expansion(peVar11,iVar7);
  pdVar5 = p1_local;
  pdVar4 = q0_local;
  peVar16 = l1;
  peVar11 = local_320;
  peVar10[-1].x_[1] = 9.2443387829241e-318;
  peVar11 = GEO::expansion::assign_dot_at(peVar11,pdVar4,(double *)peVar16,pdVar5,dim);
  dVar2 = local_310;
  peVar10[-1].x_[1] = 9.24441783342744e-318;
  a32 = GEO::expansion::scale_fast(peVar11,dVar2);
  peVar10[-1].x_[1] = 9.24449688393077e-318;
  iVar7 = GEO::expansion::dot_at_capacity(dim);
  peVar10[-1].x_[1] = 9.24453146852598e-318;
  sVar9 = GEO::expansion::bytes(iVar7);
  peVar10 = (expansion *)((long)peVar10 - (sVar9 + 0xf & 0xfffffffffffffff0));
  local_318 = peVar10;
  peVar10[-1].x_[1] = 9.24470933215848e-318;
  iVar7 = GEO::expansion::dot_at_capacity(dim);
  peVar11 = local_318;
  peVar10[-1].x_[1] = 9.2447785013489e-318;
  GEO::expansion::expansion(peVar11,iVar7);
  pdVar5 = p1_local;
  pdVar4 = q0_local;
  peVar11 = local_318;
  peVar10[-1].x_[1] = 9.2449217803862e-318;
  peVar11 = GEO::expansion::assign_dot_at(peVar11,pdVar4,q2,pdVar5,dim);
  dVar2 = local_310;
  peVar10[-1].x_[1] = 9.24500083088953e-318;
  b00 = GEO::expansion::scale_fast(peVar11,dVar2);
  peVar12 = a12;
  peVar13 = a20;
  peVar16 = a22;
  peVar11 = a30;
  peVar10[-1].x_[1] = 9.24513916927037e-318;
  iVar7 = GEO::expansion::det2x2_capacity(peVar12,peVar13,peVar16,peVar11);
  peVar10[-1].x_[1] = 9.24517375386558e-318;
  sVar9 = GEO::expansion::bytes(iVar7);
  peVar12 = a12;
  peVar13 = a20;
  peVar16 = a22;
  peVar11 = a30;
  peVar10 = (expansion *)((long)peVar10 - (sVar9 + 0xf & 0xfffffffffffffff0));
  local_308 = peVar10;
  peVar10[-1].x_[1] = 9.24541090537558e-318;
  iVar7 = GEO::expansion::det2x2_capacity(peVar12,peVar13,peVar16,peVar11);
  peVar11 = local_308;
  peVar10[-1].x_[1] = 9.245480074566e-318;
  GEO::expansion::expansion(peVar11,iVar7);
  peVar14 = a12;
  peVar12 = a20;
  peVar13 = a22;
  peVar16 = a30;
  peVar11 = local_308;
  peVar10[-1].x_[1] = 9.24561841294683e-318;
  b01 = GEO::expansion::assign_det2x2(peVar11,peVar14,peVar12,peVar13,peVar16);
  peVar16 = a22;
  peVar11 = a30;
  peVar10[-1].x_[1] = 9.245717226076e-318;
  iVar7 = GEO::expansion::diff_capacity(peVar16,peVar11);
  peVar10[-1].x_[1] = 9.24575181067121e-318;
  sVar9 = GEO::expansion::bytes(iVar7);
  peVar16 = a22;
  peVar11 = a30;
  peVar10 = (expansion *)((long)peVar10 - (sVar9 + 0xf & 0xfffffffffffffff0));
  local_300 = peVar10;
  peVar10[-1].x_[1] = 9.24594943692955e-318;
  iVar7 = GEO::expansion::diff_capacity(peVar16,peVar11);
  peVar11 = local_300;
  peVar10[-1].x_[1] = 9.24601860611996e-318;
  GEO::expansion::expansion(peVar11,iVar7);
  peVar13 = a22;
  peVar16 = a30;
  peVar11 = local_300;
  peVar10[-1].x_[1] = 9.24611741924913e-318;
  b02 = GEO::expansion::assign_diff(peVar11,peVar13,peVar16);
  peVar16 = a12;
  peVar11 = a20;
  peVar10[-1].x_[1] = 9.2462162323783e-318;
  iVar7 = GEO::expansion::diff_capacity(peVar11,peVar16);
  peVar10[-1].x_[1] = 9.24625081697351e-318;
  sVar9 = GEO::expansion::bytes(iVar7);
  peVar16 = a12;
  peVar11 = a20;
  peVar10 = (expansion *)((long)peVar10 - (sVar9 + 0xf & 0xfffffffffffffff0));
  local_2f8 = peVar10;
  peVar10[-1].x_[1] = 9.24644844323185e-318;
  iVar7 = GEO::expansion::diff_capacity(peVar11,peVar16);
  peVar11 = local_2f8;
  peVar10[-1].x_[1] = 9.24651761242226e-318;
  GEO::expansion::expansion(peVar11,iVar7);
  peVar13 = a12;
  peVar16 = a20;
  peVar11 = local_2f8;
  peVar10[-1].x_[1] = 9.24661642555143e-318;
  b10 = GEO::expansion::assign_diff(peVar11,peVar16,peVar13);
  peVar12 = a11;
  peVar13 = a20;
  peVar16 = a21;
  peVar11 = a30;
  peVar10[-1].x_[1] = 9.24675476393227e-318;
  iVar7 = GEO::expansion::det2x2_capacity(peVar13,peVar12,peVar11,peVar16);
  peVar10[-1].x_[1] = 9.24678934852748e-318;
  sVar9 = GEO::expansion::bytes(iVar7);
  peVar12 = a11;
  peVar13 = a20;
  peVar16 = a21;
  peVar11 = a30;
  peVar10 = (expansion *)((long)peVar10 - (sVar9 + 0xf & 0xfffffffffffffff0));
  local_2f0 = peVar10;
  peVar10[-1].x_[1] = 9.24702650003748e-318;
  iVar7 = GEO::expansion::det2x2_capacity(peVar13,peVar12,peVar11,peVar16);
  peVar11 = local_2f0;
  peVar10[-1].x_[1] = 9.2470956692279e-318;
  GEO::expansion::expansion(peVar11,iVar7);
  peVar14 = a11;
  peVar12 = a20;
  peVar13 = a21;
  peVar16 = a30;
  peVar11 = local_2f0;
  peVar10[-1].x_[1] = 9.24723400760873e-318;
  b11 = GEO::expansion::assign_det2x2(peVar11,peVar12,peVar14,peVar16,peVar13);
  peVar16 = a21;
  peVar11 = a30;
  peVar10[-1].x_[1] = 9.2473328207379e-318;
  iVar7 = GEO::expansion::diff_capacity(peVar11,peVar16);
  peVar10[-1].x_[1] = 9.24736740533311e-318;
  sVar9 = GEO::expansion::bytes(iVar7);
  peVar16 = a21;
  peVar11 = a30;
  peVar10 = (expansion *)((long)peVar10 - (sVar9 + 0xf & 0xfffffffffffffff0));
  local_2e8 = peVar10;
  peVar10[-1].x_[1] = 9.24756503159145e-318;
  iVar7 = GEO::expansion::diff_capacity(peVar11,peVar16);
  peVar11 = local_2e8;
  peVar10[-1].x_[1] = 9.24763420078186e-318;
  GEO::expansion::expansion(peVar11,iVar7);
  peVar13 = a21;
  peVar16 = a30;
  peVar11 = local_2e8;
  peVar10[-1].x_[1] = 9.24773301391103e-318;
  b12 = GEO::expansion::assign_diff(peVar11,peVar16,peVar13);
  peVar16 = a11;
  peVar11 = a20;
  peVar10[-1].x_[1] = 9.2478318270402e-318;
  iVar7 = GEO::expansion::diff_capacity(peVar16,peVar11);
  peVar10[-1].x_[1] = 9.24786641163541e-318;
  sVar9 = GEO::expansion::bytes(iVar7);
  peVar16 = a11;
  peVar11 = a20;
  peVar10 = (expansion *)((long)peVar10 - (sVar9 + 0xf & 0xfffffffffffffff0));
  local_2e0 = peVar10;
  peVar10[-1].x_[1] = 9.24806403789375e-318;
  iVar7 = GEO::expansion::diff_capacity(peVar16,peVar11);
  peVar11 = local_2e0;
  peVar10[-1].x_[1] = 9.24813320708416e-318;
  GEO::expansion::expansion(peVar11,iVar7);
  peVar13 = a11;
  peVar16 = a20;
  peVar11 = local_2e0;
  peVar10[-1].x_[1] = 9.24823202021333e-318;
  b20 = GEO::expansion::assign_diff(peVar11,peVar13,peVar16);
  peVar12 = a11;
  peVar13 = a12;
  peVar16 = a21;
  peVar11 = a22;
  peVar10[-1].x_[1] = 9.24837035859417e-318;
  iVar7 = GEO::expansion::det2x2_capacity(peVar12,peVar13,peVar16,peVar11);
  peVar10[-1].x_[1] = 9.24840494318938e-318;
  sVar9 = GEO::expansion::bytes(iVar7);
  peVar12 = a11;
  peVar13 = a12;
  peVar16 = a21;
  peVar11 = a22;
  peVar10 = (expansion *)((long)peVar10 - (sVar9 + 0xf & 0xfffffffffffffff0));
  local_2d8 = peVar10;
  peVar10[-1].x_[1] = 9.24864209469938e-318;
  iVar7 = GEO::expansion::det2x2_capacity(peVar12,peVar13,peVar16,peVar11);
  peVar11 = local_2d8;
  peVar10[-1].x_[1] = 9.2487112638898e-318;
  GEO::expansion::expansion(peVar11,iVar7);
  peVar12 = a11;
  peVar13 = a12;
  peVar16 = a21;
  peVar14 = a22;
  peVar11 = local_2d8;
  peVar10[-1].x_[1] = 9.24884960227063e-318;
  b21 = GEO::expansion::assign_det2x2(peVar11,peVar12,peVar13,peVar16,peVar14);
  peVar16 = a21;
  peVar11 = a22;
  peVar10[-1].x_[1] = 9.2489484153998e-318;
  iVar7 = GEO::expansion::diff_capacity(peVar16,peVar11);
  peVar10[-1].x_[1] = 9.24898299999501e-318;
  sVar9 = GEO::expansion::bytes(iVar7);
  peVar16 = a21;
  peVar11 = a22;
  peVar10 = (expansion *)((long)peVar10 - (sVar9 + 0xf & 0xfffffffffffffff0));
  local_2d0 = peVar10;
  peVar10[-1].x_[1] = 9.24918062625335e-318;
  iVar7 = GEO::expansion::diff_capacity(peVar16,peVar11);
  peVar11 = local_2d0;
  peVar10[-1].x_[1] = 9.24924979544377e-318;
  GEO::expansion::expansion(peVar11,iVar7);
  peVar13 = a21;
  peVar16 = a22;
  peVar11 = local_2d0;
  peVar10[-1].x_[1] = 9.24934860857293e-318;
  b22 = GEO::expansion::assign_diff(peVar11,peVar13,peVar16);
  peVar16 = a11;
  peVar11 = a12;
  peVar10[-1].x_[1] = 9.2494474217021e-318;
  iVar7 = GEO::expansion::diff_capacity(peVar11,peVar16);
  peVar10[-1].x_[1] = 9.24948200629731e-318;
  sVar9 = GEO::expansion::bytes(iVar7);
  peVar16 = a11;
  peVar11 = a12;
  peVar10 = (expansion *)((long)peVar10 - (sVar9 + 0xf & 0xfffffffffffffff0));
  local_2c8 = peVar10;
  peVar10[-1].x_[1] = 9.24967963255565e-318;
  iVar7 = GEO::expansion::diff_capacity(peVar11,peVar16);
  peVar11 = local_2c8;
  peVar10[-1].x_[1] = 9.24974880174607e-318;
  GEO::expansion::expansion(peVar11,iVar7);
  peVar13 = a11;
  peVar16 = a12;
  peVar11 = local_2c8;
  peVar10[-1].x_[1] = 9.24984761487523e-318;
  Delta = GEO::expansion::assign_diff(peVar11,peVar16,peVar13);
  peVar13 = b01;
  peVar16 = b11;
  peVar11 = b21;
  peVar10[-1].x_[1] = 9.25001065653836e-318;
  iVar7 = GEO::expansion::sum_capacity(peVar13,peVar16,peVar11);
  peVar10[-1].x_[1] = 9.25004524113357e-318;
  sVar9 = GEO::expansion::bytes(iVar7);
  peVar13 = b01;
  peVar16 = b11;
  peVar11 = b21;
  peVar10 = (expansion *)((long)peVar10 - (sVar9 + 0xf & 0xfffffffffffffff0));
  local_2c0 = peVar10;
  peVar10[-1].x_[1] = 9.25030709592587e-318;
  iVar7 = GEO::expansion::sum_capacity(peVar13,peVar16,peVar11);
  peVar11 = local_2c0;
  peVar10[-1].x_[1] = 9.25037626511628e-318;
  GEO::expansion::expansion(peVar11,iVar7);
  peVar12 = b01;
  peVar13 = b11;
  peVar16 = b21;
  peVar11 = local_2c0;
  peVar10[-1].x_[1] = 9.25053930677941e-318;
  peVar11 = GEO::expansion::assign_sum(peVar11,peVar12,peVar13,peVar16);
  peStack_f0 = peVar11;
  peVar10[-1].x_[1] = 9.25063317925212e-318;
  local_f4 = GEO::expansion::sign
                       (peVar11,(EVP_PKEY_CTX *)peVar12,sig,(size_t *)peVar16,(uchar *)peVar14,
                        (size_t)q1);
  peVar16 = l2;
  peVar11 = b02;
  if (local_f4 == 0) {
    local_378 = &local_119;
    peVar10[-1].x_[1] = 9.25082092419754e-318;
    std::allocator<char>::allocator();
    paVar3 = local_378;
    peVar10[-1].x_[1] = 9.25094938126546e-318;
    std::__cxx11::string::string(local_118,"Delta_sign != ZERO",paVar3);
    local_380 = (allocator *)((long)&b01_l1 + 7);
    peVar10[-1].x_[1] = 9.25105313505109e-318;
    std::allocator<char>::allocator();
    paVar3 = local_380;
    peVar10[-1].x_[1] = 9.25118159211901e-318;
    std::__cxx11::string::string
              (local_150,
               "/workspace/llm4binary/github/license_all_cmakelists_25/simogasp[P]delaunay-psm/delaunay-psm/Delaunay_psm.cpp"
               ,paVar3);
    peVar10[-1].x_[1] = (double)&LAB_001c9266;
    GEO::geo_assertion_failed((string *)local_118,(string *)local_150,0x4d25);
  }
  peVar10[-1].x_[1] = 9.25194739387006e-318;
  iVar7 = GEO::expansion::product_capacity(peVar11,peVar16);
  peVar10[-1].x_[1] = 9.25198197846527e-318;
  sVar9 = GEO::expansion::bytes(iVar7);
  peVar16 = l2;
  peVar11 = b02;
  peVar10 = (expansion *)((long)peVar10 - (sVar9 + 0xf & 0xfffffffffffffff0));
  local_3f0 = peVar10;
  peVar10[-1].x_[1] = 9.25219442669298e-318;
  iVar7 = GEO::expansion::product_capacity(peVar11,peVar16);
  peVar11 = local_3f0;
  peVar10[-1].x_[1] = 9.2522635958834e-318;
  GEO::expansion::expansion(peVar11,iVar7);
  peVar13 = l2;
  peVar16 = b02;
  peVar11 = local_3f0;
  peVar10[-1].x_[1] = 9.25237723098194e-318;
  peVar12 = GEO::expansion::assign_product(peVar11,peVar16,peVar13);
  peVar16 = l3;
  peVar11 = b10;
  peVar10[-1].x_[1] = 9.25249086608048e-318;
  iVar7 = GEO::expansion::product_capacity(peVar11,peVar16);
  peVar10[-1].x_[1] = 9.25252545067569e-318;
  sVar9 = GEO::expansion::bytes(iVar7);
  peVar16 = l3;
  peVar11 = b10;
  peVar10 = (expansion *)((long)peVar10 - (sVar9 + 0xf & 0xfffffffffffffff0));
  local_3e8 = peVar10;
  peVar10[-1].x_[1] = 9.2527378989034e-318;
  iVar7 = GEO::expansion::product_capacity(peVar11,peVar16);
  peVar11 = local_3e8;
  peVar10[-1].x_[1] = 9.25280706809382e-318;
  GEO::expansion::expansion(peVar11,iVar7);
  peVar13 = l3;
  peVar16 = b10;
  peVar11 = local_3e8;
  peVar10[-1].x_[1] = 9.25292070319237e-318;
  peVar13 = GEO::expansion::assign_product(peVar11,peVar16,peVar13);
  peVar11 = b01;
  peVar10[-1].x_[1] = 9.25308374485549e-318;
  iVar7 = GEO::expansion::sum_capacity(peVar12,peVar13,peVar11);
  peVar10[-1].x_[1] = 9.2531183294507e-318;
  sVar9 = GEO::expansion::bytes(iVar7);
  peVar11 = b01;
  peVar10 = (expansion *)((long)peVar10 - (sVar9 + 0xf & 0xfffffffffffffff0));
  local_3e0 = peVar10;
  peVar10[-1].x_[1] = 9.253380184243e-318;
  iVar7 = GEO::expansion::sum_capacity(peVar12,peVar13,peVar11);
  peVar11 = local_3e0;
  peVar10[-1].x_[1] = 9.25344935343342e-318;
  GEO::expansion::expansion(peVar11,iVar7);
  peVar16 = b01;
  peVar11 = local_3e0;
  peVar10[-1].x_[1] = 9.25361239509654e-318;
  peVar12 = GEO::expansion::assign_sum(peVar11,peVar12,peVar13,peVar16);
  peVar16 = l2;
  peVar11 = b12;
  peVar10[-1].x_[1] = 9.25372603019509e-318;
  iVar7 = GEO::expansion::product_capacity(peVar11,peVar16);
  peVar10[-1].x_[1] = 9.2537606147903e-318;
  sVar9 = GEO::expansion::bytes(iVar7);
  peVar16 = l2;
  peVar11 = b12;
  peVar10 = (expansion *)((long)peVar10 - (sVar9 + 0xf & 0xfffffffffffffff0));
  local_3d8 = peVar10;
  peVar10[-1].x_[1] = 9.25397306301801e-318;
  iVar7 = GEO::expansion::product_capacity(peVar11,peVar16);
  peVar11 = local_3d8;
  peVar10[-1].x_[1] = 9.25404223220843e-318;
  GEO::expansion::expansion(peVar11,iVar7);
  peVar13 = l2;
  peVar16 = b12;
  peVar11 = local_3d8;
  peVar10[-1].x_[1] = 9.25415586730697e-318;
  peVar14 = GEO::expansion::assign_product(peVar11,peVar16,peVar13);
  peVar16 = l3;
  peVar11 = b20;
  peVar10[-1].x_[1] = 9.25426950240551e-318;
  iVar7 = GEO::expansion::product_capacity(peVar11,peVar16);
  peVar10[-1].x_[1] = 9.25430408700072e-318;
  sVar9 = GEO::expansion::bytes(iVar7);
  peVar16 = l3;
  peVar11 = b20;
  peVar10 = (expansion *)((long)peVar10 - (sVar9 + 0xf & 0xfffffffffffffff0));
  local_3d0 = peVar10;
  peVar10[-1].x_[1] = 9.25451653522843e-318;
  iVar7 = GEO::expansion::product_capacity(peVar11,peVar16);
  peVar11 = local_3d0;
  peVar10[-1].x_[1] = 9.25458570441885e-318;
  GEO::expansion::expansion(peVar11,iVar7);
  peVar13 = l3;
  peVar16 = b20;
  peVar11 = local_3d0;
  peVar10[-1].x_[1] = 9.25469933951739e-318;
  peVar13 = GEO::expansion::assign_product(peVar11,peVar16,peVar13);
  peVar11 = b11;
  peVar10[-1].x_[1] = 9.25486238118052e-318;
  iVar7 = GEO::expansion::sum_capacity(peVar14,peVar13,peVar11);
  peVar10[-1].x_[1] = 9.25489696577573e-318;
  sVar9 = GEO::expansion::bytes(iVar7);
  peVar11 = b11;
  peVar10 = (expansion *)((long)peVar10 - (sVar9 + 0xf & 0xfffffffffffffff0));
  local_3c8 = peVar10;
  peVar10[-1].x_[1] = 9.25515882056803e-318;
  iVar7 = GEO::expansion::sum_capacity(peVar14,peVar13,peVar11);
  peVar11 = local_3c8;
  peVar10[-1].x_[1] = 9.25522798975844e-318;
  GEO::expansion::expansion(peVar11,iVar7);
  peVar16 = b11;
  peVar11 = local_3c8;
  peVar10[-1].x_[1] = 9.25539103142157e-318;
  peVar14 = GEO::expansion::assign_sum(peVar11,peVar14,peVar13,peVar16);
  peVar16 = l2;
  peVar11 = b22;
  peVar10[-1].x_[1] = 9.25550466652012e-318;
  iVar7 = GEO::expansion::product_capacity(peVar11,peVar16);
  peVar10[-1].x_[1] = 9.25553925111532e-318;
  sVar9 = GEO::expansion::bytes(iVar7);
  peVar16 = l2;
  peVar11 = b22;
  peVar10 = (expansion *)((long)peVar10 - (sVar9 + 0xf & 0xfffffffffffffff0));
  local_3c0 = peVar10;
  peVar10[-1].x_[1] = 9.25575169934304e-318;
  iVar7 = GEO::expansion::product_capacity(peVar11,peVar16);
  peVar11 = local_3c0;
  peVar10[-1].x_[1] = 9.25582086853345e-318;
  GEO::expansion::expansion(peVar11,iVar7);
  peVar13 = l2;
  peVar16 = b22;
  peVar11 = local_3c0;
  peVar10[-1].x_[1] = 9.255934503632e-318;
  peVar15 = GEO::expansion::assign_product(peVar11,peVar16,peVar13);
  peVar16 = l3;
  peVar11 = Delta;
  peVar10[-1].x_[1] = 9.25604813873054e-318;
  iVar7 = GEO::expansion::product_capacity(peVar11,peVar16);
  peVar10[-1].x_[1] = 9.25608272332575e-318;
  sVar9 = GEO::expansion::bytes(iVar7);
  peVar16 = l3;
  peVar11 = Delta;
  peVar10 = (expansion *)((long)peVar10 - (sVar9 + 0xf & 0xfffffffffffffff0));
  local_3b8 = peVar10;
  peVar10[-1].x_[1] = 9.25629517155346e-318;
  iVar7 = GEO::expansion::product_capacity(peVar11,peVar16);
  peVar11 = local_3b8;
  peVar10[-1].x_[1] = 9.25636434074388e-318;
  GEO::expansion::expansion(peVar11,iVar7);
  peVar13 = l3;
  peVar16 = Delta;
  peVar11 = local_3b8;
  peVar10[-1].x_[1] = 9.25647797584242e-318;
  peVar13 = GEO::expansion::assign_product(peVar11,peVar16,peVar13);
  peVar11 = b21;
  peVar10[-1].x_[1] = 9.25664101750555e-318;
  iVar7 = GEO::expansion::sum_capacity(peVar15,peVar13,peVar11);
  peVar10[-1].x_[1] = 9.25667560210076e-318;
  sVar9 = GEO::expansion::bytes(iVar7);
  peVar11 = b21;
  peVar10 = (expansion *)((long)peVar10 - (sVar9 + 0xf & 0xfffffffffffffff0));
  local_3b0 = peVar10;
  peVar10[-1].x_[1] = 9.25693745689306e-318;
  iVar7 = GEO::expansion::sum_capacity(peVar15,peVar13,peVar11);
  peVar11 = local_3b0;
  peVar10[-1].x_[1] = 9.25700662608347e-318;
  GEO::expansion::expansion(peVar11,iVar7);
  peVar16 = b21;
  peVar11 = local_3b0;
  peVar10[-1].x_[1] = 9.2571696677466e-318;
  peVar15 = GEO::expansion::assign_sum(peVar11,peVar15,peVar13,peVar16);
  peVar16 = a10;
  peVar11 = peStack_f0;
  peVar10[-1].x_[1] = 9.25728330284514e-318;
  iVar7 = GEO::expansion::product_capacity(peVar11,peVar16);
  peVar10[-1].x_[1] = 9.25731788744035e-318;
  sVar9 = GEO::expansion::bytes(iVar7);
  peVar16 = a10;
  peVar11 = peStack_f0;
  peVar10 = (expansion *)((long)peVar10 - (sVar9 + 0xf & 0xfffffffffffffff0));
  local_3a8 = peVar10;
  peVar10[-1].x_[1] = 9.25753033566807e-318;
  iVar7 = GEO::expansion::product_capacity(peVar11,peVar16);
  peVar11 = local_3a8;
  peVar10[-1].x_[1] = 9.25759950485848e-318;
  GEO::expansion::expansion(peVar11,iVar7);
  peVar13 = a10;
  peVar16 = peStack_f0;
  peVar11 = local_3a8;
  peVar10[-1].x_[1] = 9.25771313995703e-318;
  peVar13 = GEO::expansion::assign_product(peVar11,peVar16,peVar13);
  peVar11 = a31;
  peVar10[-1].x_[1] = 9.25784159702495e-318;
  iVar7 = GEO::expansion::product_capacity(peVar11,peVar12);
  peVar10[-1].x_[1] = 9.25787618162015e-318;
  sVar9 = GEO::expansion::bytes(iVar7);
  peVar11 = a31;
  peVar10 = (expansion *)((long)peVar10 - (sVar9 + 0xf & 0xfffffffffffffff0));
  local_3a0 = peVar10;
  peVar10[-1].x_[1] = 9.25810345181724e-318;
  iVar7 = GEO::expansion::product_capacity(peVar11,peVar12);
  peVar11 = local_3a0;
  peVar10[-1].x_[1] = 9.25817262100766e-318;
  GEO::expansion::expansion(peVar11,iVar7);
  peVar16 = a31;
  peVar11 = local_3a0;
  peVar10[-1].x_[1] = 9.25830107807558e-318;
  peVar11 = GEO::expansion::assign_product(peVar11,peVar16,peVar12);
  peVar10[-1].x_[1] = 9.25834060332724e-318;
  peVar12 = GEO::expansion::negate(peVar11);
  peVar11 = a32;
  peVar10[-1].x_[1] = 9.25846906039516e-318;
  iVar7 = GEO::expansion::product_capacity(peVar11,peVar14);
  peVar10[-1].x_[1] = 9.25850364499037e-318;
  sVar9 = GEO::expansion::bytes(iVar7);
  peVar11 = a32;
  peVar10 = (expansion *)((long)peVar10 - (sVar9 + 0xf & 0xfffffffffffffff0));
  local_398 = peVar10;
  peVar10[-1].x_[1] = 9.25873091518746e-318;
  iVar7 = GEO::expansion::product_capacity(peVar11,peVar14);
  peVar11 = local_398;
  peVar10[-1].x_[1] = 9.25880008437788e-318;
  GEO::expansion::expansion(peVar11,iVar7);
  peVar16 = a32;
  peVar11 = local_398;
  peVar10[-1].x_[1] = 9.2589285414458e-318;
  peVar11 = GEO::expansion::assign_product(peVar11,peVar16,peVar14);
  peVar10[-1].x_[1] = 9.25896806669746e-318;
  peVar14 = GEO::expansion::negate(peVar11);
  peVar11 = b00;
  peVar10[-1].x_[1] = 9.25909652376538e-318;
  iVar7 = GEO::expansion::product_capacity(peVar11,peVar15);
  peVar10[-1].x_[1] = 9.25913110836059e-318;
  sVar9 = GEO::expansion::bytes(iVar7);
  peVar11 = b00;
  peVar10 = (expansion *)((long)peVar10 - (sVar9 + 0xf & 0xfffffffffffffff0));
  local_390 = peVar10;
  peVar10[-1].x_[1] = 9.25935837855768e-318;
  iVar7 = GEO::expansion::product_capacity(peVar11,peVar15);
  peVar11 = local_390;
  peVar10[-1].x_[1] = 9.2594275477481e-318;
  GEO::expansion::expansion(peVar11,iVar7);
  peVar16 = b00;
  peVar11 = local_390;
  peVar10[-1].x_[1] = 9.25955600481601e-318;
  peVar11 = GEO::expansion::assign_product(peVar11,peVar16,peVar15);
  peVar10[-1].x_[1] = 9.25959553006768e-318;
  peVar16 = GEO::expansion::negate(peVar11);
  peVar10[-1].x_[1] = 9.25979315632602e-318;
  iVar7 = GEO::expansion::sum_capacity(peVar13,peVar12,peVar14,peVar16);
  peVar10[-1].x_[1] = 9.25982774092123e-318;
  sVar9 = GEO::expansion::bytes(iVar7);
  peVar10 = (expansion *)((long)peVar10 - (sVar9 + 0xf & 0xfffffffffffffff0));
  local_388 = peVar10;
  peVar10[-1].x_[1] = 9.26012418030873e-318;
  iVar7 = GEO::expansion::sum_capacity(peVar13,peVar12,peVar14,peVar16);
  peVar11 = local_388;
  peVar10[-1].x_[1] = 9.26019334949915e-318;
  GEO::expansion::expansion(peVar11,iVar7);
  peVar11 = local_388;
  peVar10[-1].x_[1] = 9.26039097575749e-318;
  peVar11 = GEO::expansion::assign_sum(peVar11,peVar13,peVar12,peVar14,peVar16);
  peVar10[-1].x_[1] = 9.2604848482302e-318;
  iVar8 = GEO::expansion::sign
                    (peVar11,(EVP_PKEY_CTX *)peVar13,sig_00,(size_t *)peVar14,(uchar *)peVar16,
                     (size_t)q1);
  if (iVar8 == 0) {
    pdStack_1f8 = p1_local;
    p_sort[0] = p2_local;
    p_sort[1] = p3_local;
    p_sort[2] = q0_local;
    peVar10[-1].x_[1] = 9.26092950731145e-318;
    SOS_sort(&stack0xfffffffffffffe08,p_sort + 3,(uint)dim);
    z1_0._4_4_ = 0;
    do {
      peVar12 = a31;
      peVar13 = b02;
      peVar11 = b10;
      if (3 < z1_0._4_4_) {
        eStack_478.x_[0] = (double)&local_2b1;
        peVar10[-1].x_[1] = 9.2719125866185e-318;
        std::allocator<char>::allocator();
        dVar2 = eStack_478.x_[0];
        peVar10[-1].x_[1] = 9.27204104368642e-318;
        std::__cxx11::string::string
                  (local_2b0,
                   "/workspace/llm4binary/github/license_all_cmakelists_25/simogasp[P]delaunay-psm/delaunay-psm/Delaunay_psm.cpp"
                   ,(allocator *)dVar2);
        peVar10[-1].x_[1] = (double)&LAB_001ca2dd;
        GEO::geo_should_not_have_reached((string *)local_2b0,0x4d73);
      }
      if (p_sort[(ulong)z1_0._4_4_ - 1] == p1_local) {
        peVar10[-1].x_[1] = 9.26125559063771e-318;
        iVar7 = GEO::expansion::sum_capacity(peVar13,peVar11);
        peVar10[-1].x_[1] = 9.26129017523292e-318;
        sVar9 = GEO::expansion::bytes(iVar7);
        peVar16 = b02;
        peVar11 = b10;
        peVar10 = (expansion *)((long)peVar10 - (sVar9 + 0xf & 0xfffffffffffffff0));
        local_428 = peVar10;
        peVar10[-1].x_[1] = 9.26151744543e-318;
        iVar7 = GEO::expansion::sum_capacity(peVar16,peVar11);
        peVar11 = local_428;
        peVar10[-1].x_[1] = 9.26158661462042e-318;
        GEO::expansion::expansion(peVar11,iVar7);
        peVar13 = b02;
        peVar16 = b10;
        peVar11 = local_428;
        peVar10[-1].x_[1] = 9.26171507168834e-318;
        peVar16 = GEO::expansion::assign_sum(peVar11,peVar13,peVar16);
        peVar11 = a31;
        z1 = peVar16;
        peVar10[-1].x_[1] = 9.26184352875626e-318;
        iVar7 = GEO::expansion::product_capacity(peVar11,peVar16);
        peVar10[-1].x_[1] = 9.26187811335147e-318;
        sVar9 = GEO::expansion::bytes(iVar7);
        peVar16 = a31;
        peVar11 = z1;
        peVar10 = (expansion *)((long)peVar10 - (sVar9 + 0xf & 0xfffffffffffffff0));
        local_420 = peVar10;
        peVar10[-1].x_[1] = 9.26210538354856e-318;
        iVar7 = GEO::expansion::product_capacity(peVar16,peVar11);
        peVar11 = local_420;
        peVar10[-1].x_[1] = 9.26217455273897e-318;
        GEO::expansion::expansion(peVar11,iVar7);
        peVar13 = a31;
        peVar16 = z1;
        peVar11 = local_420;
        peVar10[-1].x_[1] = 9.26230300980689e-318;
        peVar11 = GEO::expansion::assign_product(peVar11,peVar13,peVar16);
        peVar10[-1].x_[1] = 9.26234253505856e-318;
        z2_0 = GEO::expansion::negate(peVar11);
        peVar16 = b12;
        peVar11 = b20;
        peVar10[-1].x_[1] = 9.26247099212648e-318;
        iVar7 = GEO::expansion::sum_capacity(peVar16,peVar11);
        peVar10[-1].x_[1] = 9.26250557672169e-318;
        sVar9 = GEO::expansion::bytes(iVar7);
        peVar16 = b12;
        peVar11 = b20;
        peVar10 = (expansion *)((long)peVar10 - (sVar9 + 0xf & 0xfffffffffffffff0));
        local_418 = peVar10;
        peVar10[-1].x_[1] = 9.26273284691877e-318;
        iVar7 = GEO::expansion::sum_capacity(peVar16,peVar11);
        peVar11 = local_418;
        peVar10[-1].x_[1] = 9.26280201610919e-318;
        GEO::expansion::expansion(peVar11,iVar7);
        peVar13 = b12;
        peVar16 = b20;
        peVar11 = local_418;
        peVar10[-1].x_[1] = 9.26293047317711e-318;
        peVar16 = GEO::expansion::assign_sum(peVar11,peVar13,peVar16);
        peVar11 = a32;
        z2 = peVar16;
        peVar10[-1].x_[1] = 9.26305893024503e-318;
        iVar7 = GEO::expansion::product_capacity(peVar11,peVar16);
        peVar10[-1].x_[1] = 9.26309351484024e-318;
        sVar9 = GEO::expansion::bytes(iVar7);
        peVar16 = a32;
        peVar11 = z2;
        peVar10 = (expansion *)((long)peVar10 - (sVar9 + 0xf & 0xfffffffffffffff0));
        local_410 = peVar10;
        peVar10[-1].x_[1] = 9.26332078503732e-318;
        iVar7 = GEO::expansion::product_capacity(peVar16,peVar11);
        peVar11 = local_410;
        peVar10[-1].x_[1] = 9.26338995422774e-318;
        GEO::expansion::expansion(peVar11,iVar7);
        peVar13 = a32;
        peVar16 = z2;
        peVar11 = local_410;
        peVar10[-1].x_[1] = 9.26351841129566e-318;
        peVar11 = GEO::expansion::assign_product(peVar11,peVar13,peVar16);
        peVar10[-1].x_[1] = 9.26355793654733e-318;
        z3_0 = GEO::expansion::negate(peVar11);
        peVar16 = b22;
        peVar11 = Delta;
        peVar10[-1].x_[1] = 9.26368639361525e-318;
        iVar7 = GEO::expansion::sum_capacity(peVar16,peVar11);
        peVar10[-1].x_[1] = 9.26372097821046e-318;
        sVar9 = GEO::expansion::bytes(iVar7);
        peVar16 = b22;
        peVar11 = Delta;
        peVar10 = (expansion *)((long)peVar10 - (sVar9 + 0xf & 0xfffffffffffffff0));
        local_408 = peVar10;
        peVar10[-1].x_[1] = 9.26394824840754e-318;
        iVar7 = GEO::expansion::sum_capacity(peVar16,peVar11);
        peVar11 = local_408;
        peVar10[-1].x_[1] = 9.26401741759796e-318;
        GEO::expansion::expansion(peVar11,iVar7);
        peVar13 = b22;
        peVar16 = Delta;
        peVar11 = local_408;
        peVar10[-1].x_[1] = 9.26414587466588e-318;
        peVar16 = GEO::expansion::assign_sum(peVar11,peVar13,peVar16);
        peVar11 = b00;
        z3 = peVar16;
        peVar10[-1].x_[1] = 9.2642743317338e-318;
        iVar7 = GEO::expansion::product_capacity(peVar11,peVar16);
        peVar10[-1].x_[1] = 9.26430891632901e-318;
        sVar9 = GEO::expansion::bytes(iVar7);
        peVar16 = b00;
        peVar11 = z3;
        peVar10 = (expansion *)((long)peVar10 - (sVar9 + 0xf & 0xfffffffffffffff0));
        local_400 = peVar10;
        peVar10[-1].x_[1] = 9.26453618652609e-318;
        iVar7 = GEO::expansion::product_capacity(peVar16,peVar11);
        peVar11 = local_400;
        peVar10[-1].x_[1] = 9.26460535571651e-318;
        GEO::expansion::expansion(peVar11,iVar7);
        peVar13 = b00;
        peVar16 = z3;
        peVar11 = local_400;
        peVar10[-1].x_[1] = 9.26473381278443e-318;
        peVar11 = GEO::expansion::assign_product(peVar11,peVar13,peVar16);
        peVar10[-1].x_[1] = 9.2647733380361e-318;
        peVar12 = GEO::expansion::negate(peVar11);
        peVar13 = peStack_f0;
        peVar16 = z2_0;
        peVar11 = z3_0;
        z = peVar12;
        peVar10[-1].x_[1] = 9.26497096429443e-318;
        iVar7 = GEO::expansion::sum_capacity(peVar13,peVar16,peVar11,peVar12);
        peVar10[-1].x_[1] = 9.26500554888964e-318;
        sVar9 = GEO::expansion::bytes(iVar7);
        peVar12 = peStack_f0;
        peVar13 = z2_0;
        peVar16 = z3_0;
        peVar11 = z;
        peVar10 = (expansion *)((long)peVar10 - (sVar9 + 0xf & 0xfffffffffffffff0));
        local_3f8 = peVar10;
        peVar10[-1].x_[1] = 9.26530198827715e-318;
        iVar7 = GEO::expansion::sum_capacity(peVar12,peVar13,peVar16,peVar11);
        peVar11 = local_3f8;
        peVar10[-1].x_[1] = 9.26537115746757e-318;
        GEO::expansion::expansion(peVar11,iVar7);
        peVar14 = peStack_f0;
        peVar12 = z2_0;
        peVar13 = z3_0;
        peVar16 = z;
        peVar11 = local_3f8;
        peVar10[-1].x_[1] = 9.2655687837259e-318;
        peVar11 = GEO::expansion::assign_sum(peVar11,peVar14,peVar12,peVar13,peVar16);
        peStack_238 = peVar11;
        peVar10[-1].x_[1] = 9.26566265619861e-318;
        iVar8 = GEO::expansion::sign
                          (peVar11,(EVP_PKEY_CTX *)peVar14,sig_01,(size_t *)peVar13,(uchar *)peVar16
                           ,(size_t)q1);
        if (iVar8 != 0) {
          return local_f4 * iVar8;
        }
        z1_1._4_4_ = 0;
      }
      else if (p_sort[(ulong)z1_0._4_4_ - 1] == p2_local) {
        peVar10[-1].x_[1] = 9.26607767134112e-318;
        iVar7 = GEO::expansion::product_capacity(peVar12,peVar13);
        peVar10[-1].x_[1] = 9.26611225593633e-318;
        sVar9 = GEO::expansion::bytes(iVar7);
        peVar13 = a31;
        peVar11 = b02;
        peVar10 = (expansion *)((long)peVar10 - (sVar9 + 0xf & 0xfffffffffffffff0));
        local_448 = peVar10;
        peVar10[-1].x_[1] = 9.26633952613341e-318;
        iVar7 = GEO::expansion::product_capacity(peVar13,peVar11);
        peVar11 = local_448;
        peVar10[-1].x_[1] = 9.26640869532383e-318;
        GEO::expansion::expansion(peVar11,iVar7);
        peVar12 = a31;
        peVar13 = b02;
        peVar11 = local_448;
        peVar10[-1].x_[1] = 9.26653715239175e-318;
        z2_1 = GEO::expansion::assign_product(peVar11,peVar12,peVar13);
        peVar13 = a32;
        peVar11 = b12;
        peVar10[-1].x_[1] = 9.26666560945967e-318;
        iVar7 = GEO::expansion::product_capacity(peVar13,peVar11);
        peVar10[-1].x_[1] = 9.26670019405488e-318;
        sVar9 = GEO::expansion::bytes(iVar7);
        peVar13 = a32;
        peVar11 = b12;
        peVar10 = (expansion *)((long)peVar10 - (sVar9 + 0xf & 0xfffffffffffffff0));
        local_440 = peVar10;
        peVar10[-1].x_[1] = 9.26692746425197e-318;
        iVar7 = GEO::expansion::product_capacity(peVar13,peVar11);
        peVar11 = local_440;
        peVar10[-1].x_[1] = 9.26699663344238e-318;
        GEO::expansion::expansion(peVar11,iVar7);
        peVar12 = a32;
        peVar13 = b12;
        peVar11 = local_440;
        peVar10[-1].x_[1] = 9.2671250905103e-318;
        z3_1 = GEO::expansion::assign_product(peVar11,peVar12,peVar13);
        peVar13 = b00;
        peVar11 = b22;
        peVar10[-1].x_[1] = 9.26725354757822e-318;
        iVar7 = GEO::expansion::product_capacity(peVar13,peVar11);
        peVar10[-1].x_[1] = 9.26728813217343e-318;
        sVar9 = GEO::expansion::bytes(iVar7);
        peVar13 = b00;
        peVar11 = b22;
        peVar10 = (expansion *)((long)peVar10 - (sVar9 + 0xf & 0xfffffffffffffff0));
        local_438 = peVar10;
        peVar10[-1].x_[1] = 9.26751540237052e-318;
        iVar7 = GEO::expansion::product_capacity(peVar13,peVar11);
        peVar11 = local_438;
        peVar10[-1].x_[1] = 9.26758457156093e-318;
        GEO::expansion::expansion(peVar11,iVar7);
        peVar12 = b00;
        peVar13 = b22;
        peVar11 = local_438;
        peVar10[-1].x_[1] = 9.26771302862885e-318;
        peVar12 = GEO::expansion::assign_product(peVar11,peVar12,peVar13);
        peVar13 = z2_1;
        peVar11 = z3_1;
        z_1 = peVar12;
        peVar10[-1].x_[1] = 9.26787607029198e-318;
        iVar7 = GEO::expansion::sum_capacity(peVar13,peVar11,peVar12);
        peVar10[-1].x_[1] = 9.26791065488719e-318;
        sVar9 = GEO::expansion::bytes(iVar7);
        peVar12 = z2_1;
        peVar13 = z3_1;
        peVar11 = z_1;
        peVar10 = (expansion *)((long)peVar10 - (sVar9 + 0xf & 0xfffffffffffffff0));
        local_430 = peVar10;
        peVar10[-1].x_[1] = 9.26817250967949e-318;
        iVar7 = GEO::expansion::sum_capacity(peVar12,peVar13,peVar11);
        peVar11 = local_430;
        peVar10[-1].x_[1] = 9.2682416788699e-318;
        GEO::expansion::expansion(peVar11,iVar7);
        peVar14 = z2_1;
        peVar12 = z3_1;
        peVar13 = z_1;
        peVar11 = local_430;
        peVar10[-1].x_[1] = 9.26840472053303e-318;
        peVar11 = GEO::expansion::assign_sum(peVar11,peVar14,peVar12,peVar13);
        peStack_260 = peVar11;
        peVar10[-1].x_[1] = 9.26849859300574e-318;
        iVar8 = GEO::expansion::sign
                          (peVar11,(EVP_PKEY_CTX *)peVar14,sig_02,(size_t *)peVar13,(uchar *)peVar16
                           ,(size_t)q1);
        if (iVar8 != 0) {
          return local_f4 * iVar8;
        }
        z1_2._4_4_ = 0;
      }
      else if (p_sort[(ulong)z1_0._4_4_ - 1] == p3_local) {
        peVar10[-1].x_[1] = 9.26891360814825e-318;
        iVar7 = GEO::expansion::product_capacity(peVar12,peVar11);
        peVar10[-1].x_[1] = 9.26894819274346e-318;
        sVar9 = GEO::expansion::bytes(iVar7);
        peVar13 = a31;
        peVar11 = b10;
        peVar10 = (expansion *)((long)peVar10 - (sVar9 + 0xf & 0xfffffffffffffff0));
        eStack_478.x_[1] = (double)peVar10;
        peVar10[-1].x_[1] = 9.26917546294054e-318;
        iVar7 = GEO::expansion::product_capacity(peVar13,peVar11);
        dVar2 = eStack_478.x_[1];
        peVar10[-1].x_[1] = 9.26924463213096e-318;
        GEO::expansion::expansion((expansion *)dVar2,iVar7);
        peVar13 = a31;
        peVar11 = b10;
        dVar2 = eStack_478.x_[1];
        peVar10[-1].x_[1] = 9.26937308919888e-318;
        z2_2 = GEO::expansion::assign_product((expansion *)dVar2,peVar13,peVar11);
        peVar13 = a32;
        peVar11 = b20;
        peVar10[-1].x_[1] = 9.2695015462668e-318;
        iVar7 = GEO::expansion::product_capacity(peVar13,peVar11);
        peVar10[-1].x_[1] = 9.26953613086201e-318;
        sVar9 = GEO::expansion::bytes(iVar7);
        peVar13 = a32;
        peVar11 = b20;
        peVar10 = (expansion *)((long)peVar10 - (sVar9 + 0xf & 0xfffffffffffffff0));
        local_460 = peVar10;
        peVar10[-1].x_[1] = 9.26976340105909e-318;
        iVar7 = GEO::expansion::product_capacity(peVar13,peVar11);
        peVar11 = local_460;
        peVar10[-1].x_[1] = 9.26983257024951e-318;
        GEO::expansion::expansion(peVar11,iVar7);
        peVar12 = a32;
        peVar13 = b20;
        peVar11 = local_460;
        peVar10[-1].x_[1] = 9.26996102731743e-318;
        z3_2 = GEO::expansion::assign_product(peVar11,peVar12,peVar13);
        peVar13 = b00;
        peVar11 = Delta;
        peVar10[-1].x_[1] = 9.27008948438535e-318;
        iVar7 = GEO::expansion::product_capacity(peVar13,peVar11);
        peVar10[-1].x_[1] = 9.27012406898056e-318;
        sVar9 = GEO::expansion::bytes(iVar7);
        peVar13 = b00;
        peVar11 = Delta;
        peVar10 = (expansion *)((long)peVar10 - (sVar9 + 0xf & 0xfffffffffffffff0));
        local_458 = peVar10;
        peVar10[-1].x_[1] = 9.27035133917765e-318;
        iVar7 = GEO::expansion::product_capacity(peVar13,peVar11);
        peVar11 = local_458;
        peVar10[-1].x_[1] = 9.27042050836806e-318;
        GEO::expansion::expansion(peVar11,iVar7);
        peVar12 = b00;
        peVar13 = Delta;
        peVar11 = local_458;
        peVar10[-1].x_[1] = 9.27054896543598e-318;
        peVar12 = GEO::expansion::assign_product(peVar11,peVar12,peVar13);
        peVar13 = z2_2;
        peVar11 = z3_2;
        z_2 = peVar12;
        peVar10[-1].x_[1] = 9.27071200709911e-318;
        iVar7 = GEO::expansion::sum_capacity(peVar13,peVar11,peVar12);
        peVar10[-1].x_[1] = 9.27074659169432e-318;
        sVar9 = GEO::expansion::bytes(iVar7);
        peVar12 = z2_2;
        peVar13 = z3_2;
        peVar11 = z_2;
        peVar10 = (expansion *)((long)peVar10 - (sVar9 + 0xf & 0xfffffffffffffff0));
        local_450 = peVar10;
        peVar10[-1].x_[1] = 9.27100844648661e-318;
        iVar7 = GEO::expansion::sum_capacity(peVar12,peVar13,peVar11);
        peVar11 = local_450;
        peVar10[-1].x_[1] = 9.27107761567703e-318;
        GEO::expansion::expansion(peVar11,iVar7);
        peVar14 = z2_2;
        peVar12 = z3_2;
        peVar13 = z_2;
        peVar11 = local_450;
        peVar10[-1].x_[1] = 9.27124065734016e-318;
        peVar11 = GEO::expansion::assign_sum(peVar11,peVar14,peVar12,peVar13);
        peStack_288 = peVar11;
        peVar10[-1].x_[1] = 9.27133452981287e-318;
        iVar8 = GEO::expansion::sign
                          (peVar11,(EVP_PKEY_CTX *)peVar14,sig_03,(size_t *)peVar13,(uchar *)peVar16
                           ,(size_t)q1);
        if (iVar8 != 0) {
          return local_f4 * iVar8;
        }
        local_28c = 0;
      }
      else if (p_sort[(ulong)z1_0._4_4_ - 1] == q0_local) {
        return NEGATIVE;
      }
      z1_0._4_4_ = z1_0._4_4_ + 1;
    } while( true );
  }
  return local_f4 * iVar8;
}

Assistant:

Sign side3_exact_SOS(
        const double* p0, const double* p1, const double* p2, const double* p3,
        const double* q0, const double* q1, const double* q2,
        coord_index_t dim
    ) {
        PCK_STAT(cnt_side3_exact++);

        const expansion& l1 = expansion_sq_dist(p1, p0, dim);
        const expansion& l2 = expansion_sq_dist(p2, p0, dim);
        const expansion& l3 = expansion_sq_dist(p3, p0, dim);

        const expansion& a10 = expansion_dot_at(p1,q0,p0, dim).scale_fast(2.0);
        const expansion& a11 = expansion_dot_at(p1,q1,p0, dim).scale_fast(2.0);
        const expansion& a12 = expansion_dot_at(p1,q2,p0, dim).scale_fast(2.0);
        const expansion& a20 = expansion_dot_at(p2,q0,p0, dim).scale_fast(2.0);
        const expansion& a21 = expansion_dot_at(p2,q1,p0, dim).scale_fast(2.0);
        const expansion& a22 = expansion_dot_at(p2,q2,p0, dim).scale_fast(2.0);

        const expansion& a30 = expansion_dot_at(p3,q0,p0, dim).scale_fast(2.0);
        const expansion& a31 = expansion_dot_at(p3,q1,p0, dim).scale_fast(2.0);
        const expansion& a32 = expansion_dot_at(p3,q2,p0, dim).scale_fast(2.0);

        // [ b00 b01 b02 ]           [  1   1   1  ]-1
        // [ b10 b11 b12 ] = Delta * [ a10 a11 a12 ]
        // [ b20 b21 b22 ]           [ a20 a21 a22 ]

        const expansion& b00 = expansion_det2x2(a11, a12, a21, a22);
        const expansion& b01 = expansion_diff(a21, a22);
        const expansion& b02 = expansion_diff(a12, a11);
        const expansion& b10 = expansion_det2x2(a12, a10, a22, a20);
        const expansion& b11 = expansion_diff(a22, a20);
        const expansion& b12 = expansion_diff(a10, a12);
        const expansion& b20 = expansion_det2x2(a10, a11, a20, a21);
        const expansion& b21 = expansion_diff(a20, a21);
        const expansion& b22 = expansion_diff(a11, a10);

        const expansion& Delta = expansion_sum3(b00, b10, b20);
        Sign Delta_sign = Delta.sign();
        // Should not occur with symbolic
        // perturbation done at previous steps.
        geo_assert(Delta_sign != ZERO);

        //       [ Lambda0 ]   [ b01 b02 ]   [ l1 ]   [ b00 ]
        // Delta [ Lambda1 ] = [ b11 b12 ] * [    ] + [ b10 ]
        //       [ Lambda2 ]   [ b21 b22 ]   [ l2 ]   [ b20 ]

        const expansion& b01_l1 = expansion_product(b01, l1);
        const expansion& b02_l2 = expansion_product(b02, l2);
        const expansion& DeltaLambda0 = expansion_sum3(b01_l1, b02_l2, b00);

        const expansion& b11_l1 = expansion_product(b11, l1);
        const expansion& b12_l2 = expansion_product(b12, l2);
        const expansion& DeltaLambda1 = expansion_sum3(b11_l1, b12_l2, b10);

        const expansion& b21_l1 = expansion_product(b21, l1);
        const expansion& b22_l2 = expansion_product(b22, l2);
        const expansion& DeltaLambda2 = expansion_sum3(b21_l1, b22_l2, b20);

        // r = Delta*l3-(a30*DeltaLambda0+a31*DeltaLambda1+a32*DeltaLambda2)

        const expansion& r0 = expansion_product(Delta, l3);
        const expansion& r1 = expansion_product(a30, DeltaLambda0).negate();
        const expansion& r2 = expansion_product(a31, DeltaLambda1).negate();
        const expansion& r3 = expansion_product(a32, DeltaLambda2).negate();
        const expansion& r = expansion_sum4(r0, r1, r2, r3);
        Sign r_sign = r.sign();

        // Statistics
        PCK_STAT(len_side3_num = std::max(len_side3_num, r.length()));
        PCK_STAT(len_side3_denom = std::max(len_side3_denom, Delta.length()));

        // Simulation of Simplicity (symbolic perturbation)
        if(r_sign == ZERO) {
            PCK_STAT(cnt_side3_SOS++);
            const double* p_sort[4];
            p_sort[0] = p0;
            p_sort[1] = p1;
            p_sort[2] = p2;
            p_sort[3] = p3;
            SOS_sort(p_sort, p_sort + 4, dim);
            for(index_t i = 0; i < 4; ++i) {
                if(p_sort[i] == p0) {
                    const expansion& z1_0 = expansion_sum(b01, b02);
                    const expansion& z1 = expansion_product(a30, z1_0).negate();
                    const expansion& z2_0 = expansion_sum(b11, b12);
                    const expansion& z2 = expansion_product(a31, z2_0).negate();
                    const expansion& z3_0 = expansion_sum(b21, b22);
                    const expansion& z3 = expansion_product(a32, z3_0).negate();
                    const expansion& z = expansion_sum4(Delta, z1, z2, z3);
                    Sign z_sign = z.sign();
                    PCK_STAT(len_side3_SOS = std::max(len_side3_SOS, z.length()));
                    if(z_sign != ZERO) {
                        return Sign(Delta_sign * z_sign);
                    }
                } else if(p_sort[i] == p1) {
                    const expansion& z1 = expansion_product(a30, b01);
                    const expansion& z2 = expansion_product(a31, b11);
                    const expansion& z3 = expansion_product(a32, b21);
                    const expansion& z = expansion_sum3(z1, z2, z3);
                    Sign z_sign = z.sign();
                    PCK_STAT(len_side3_SOS = std::max(len_side3_SOS, z.length()));
                    if(z_sign != ZERO) {
                        return Sign(Delta_sign * z_sign);
                    }
                } else if(p_sort[i] == p2) {
                    const expansion& z1 = expansion_product(a30, b02);
                    const expansion& z2 = expansion_product(a31, b12);
                    const expansion& z3 = expansion_product(a32, b22);
                    const expansion& z = expansion_sum3(z1, z2, z3);
                    Sign z_sign = z.sign();
                    PCK_STAT(len_side3_SOS = std::max(len_side3_SOS, z.length()));
                    if(z_sign != ZERO) {
                        return Sign(Delta_sign * z_sign);
                    }
                } else if(p_sort[i] == p3) {
                    return NEGATIVE;
                }
            }
            geo_assert_not_reached;
        }
        return Sign(Delta_sign * r_sign);
    }